

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O2

ostream * operator<<(ostream *os,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *v)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  pointer pbVar4;
  
  std::operator<<(os,"[");
  pbVar1 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pbVar4 = (v->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    if (!bVar2) {
      std::operator<<(os,", ");
    }
    std::operator<<(os,(string *)pbVar4);
    bVar2 = false;
  }
  poVar3 = std::operator<<(os,"]");
  return poVar3;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
    os << "[";   
    bool first = true;
    
    for (const auto& x : v) {
        if (!first) {
            os << ", ";
        }

        first = false;
        os << x;
    }

    return os << "]";
}